

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v7::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_view message;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  char *in_RCX;
  detail *in_RDX;
  size_t in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  string local_290;
  runtime_error local_270 [16];
  buffer<char> local_260;
  char local_240 [536];
  
  this->error_code_ = (int)ctx;
  local_260.size_ = 0;
  local_260._vptr_buffer = (_func_int **)&PTR_grow_0032edd0;
  local_260.capacity_ = 500;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)in_R9;
  format_str.size_ = in_R8;
  format_str.data_ = in_RCX;
  local_260.ptr_ = local_240;
  detail::vformat_abi_cxx11_(&local_290,in_RDX,format_str,args);
  paVar1 = &local_290.field_2;
  message.size_ = local_290._M_string_length;
  message.data_ = local_290._M_dataplus._M_p;
  format_system_error(&local_260,(int)ctx,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,local_260.ptr_,local_260.ptr_ + local_260.size_);
  std::runtime_error::runtime_error(local_270,(string *)&local_290);
  std::runtime_error::operator=(&this->super_runtime_error,local_270);
  iVar2 = std::runtime_error::~runtime_error(local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
    iVar2 = extraout_EAX;
  }
  if (local_260.ptr_ != local_240) {
    operator_delete(local_260.ptr_);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}